

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noui.cpp
# Opt level: O3

void noui_test_redirect(void)

{
  function<bool_(const_bilingual_str_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_int)>
  fn;
  function<bool_(const_bilingual_str_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_int)>
  fn_00;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  fn_01;
  long in_FS_OFFSET;
  undefined8 in_stack_ffffffffffffff78;
  undefined8 in_stack_ffffffffffffff80;
  _Manager_type in_stack_ffffffffffffff88;
  _Invoker_type in_stack_ffffffffffffff90;
  code *pcVar1;
  code *local_60;
  undefined8 local_58;
  code *local_50;
  code *local_48;
  code *local_40;
  undefined8 local_38;
  code *local_30;
  code *local_28;
  connection local_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  boost::signals2::connection::disconnect(&noui_ThreadSafeMessageBoxConn);
  boost::signals2::connection::disconnect(&noui_ThreadSafeQuestionConn);
  boost::signals2::connection::disconnect(&noui_InitMessageConn);
  local_38 = 0;
  local_40 = noui_ThreadSafeMessageBoxRedirect;
  local_28 = std::
             _Function_handler<bool_(const_bilingual_str_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_int),_bool_(*)(const_bilingual_str_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_int)>
             ::_M_invoke;
  local_30 = std::
             _Function_handler<bool_(const_bilingual_str_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_int),_bool_(*)(const_bilingual_str_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_int)>
             ::_M_manager;
  fn.super__Function_base._M_functor._8_8_ = in_stack_ffffffffffffff80;
  fn.super__Function_base._M_functor._M_unused._M_object = (void *)in_stack_ffffffffffffff78;
  fn.super__Function_base._M_manager = in_stack_ffffffffffffff88;
  fn._M_invoker = (_Invoker_type)in_stack_ffffffffffffff90;
  CClientUIInterface::ThreadSafeMessageBox_connect((CClientUIInterface *)&local_20,fn);
  boost::signals2::connection::operator=(&noui_ThreadSafeMessageBoxConn,&local_20);
  boost::detail::weak_count::~weak_count(&local_20._weak_connection_body.pn);
  if (local_30 != (code *)0x0) {
    (*local_30)(&local_40,&local_40,3);
  }
  local_58 = 0;
  local_60 = noui_ThreadSafeQuestionRedirect;
  local_48 = std::
             _Function_handler<bool_(const_bilingual_str_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_int),_bool_(*)(const_bilingual_str_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_int)>
             ::_M_invoke;
  local_50 = std::
             _Function_handler<bool_(const_bilingual_str_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_int),_bool_(*)(const_bilingual_str_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_int)>
             ::_M_manager;
  fn_00.super__Function_base._M_functor._8_8_ = in_stack_ffffffffffffff80;
  fn_00.super__Function_base._M_functor._M_unused._M_object = (void *)in_stack_ffffffffffffff78;
  fn_00.super__Function_base._M_manager = in_stack_ffffffffffffff88;
  fn_00._M_invoker = in_stack_ffffffffffffff90;
  CClientUIInterface::ThreadSafeQuestion_connect((CClientUIInterface *)&local_20,fn_00);
  boost::signals2::connection::operator=(&noui_ThreadSafeQuestionConn,&local_20);
  boost::detail::weak_count::~weak_count(&local_20._weak_connection_body.pn);
  if (local_50 != (code *)0x0) {
    (*local_50)(&local_60,&local_60,3);
  }
  pcVar1 = std::
           _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
           ::_M_manager;
  fn_01.super__Function_base._M_functor._8_8_ = noui_InitMessageRedirect;
  fn_01.super__Function_base._M_functor._M_unused._M_object = (void *)in_stack_ffffffffffffff78;
  fn_01.super__Function_base._M_manager = (_Manager_type)0x0;
  fn_01._M_invoker =
       std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_manager;
  CClientUIInterface::InitMessage_connect((CClientUIInterface *)&local_20,fn_01);
  boost::signals2::connection::operator=(&noui_InitMessageConn,&local_20);
  boost::detail::weak_count::~weak_count(&local_20._weak_connection_body.pn);
  if (pcVar1 != (code *)0x0) {
    (*pcVar1)(&stack0xffffffffffffff80,&stack0xffffffffffffff80,3);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void noui_test_redirect()
{
    noui_ThreadSafeMessageBoxConn.disconnect();
    noui_ThreadSafeQuestionConn.disconnect();
    noui_InitMessageConn.disconnect();
    noui_ThreadSafeMessageBoxConn = uiInterface.ThreadSafeMessageBox_connect(noui_ThreadSafeMessageBoxRedirect);
    noui_ThreadSafeQuestionConn = uiInterface.ThreadSafeQuestion_connect(noui_ThreadSafeQuestionRedirect);
    noui_InitMessageConn = uiInterface.InitMessage_connect(noui_InitMessageRedirect);
}